

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O1

void Abc_NtkExpandCubes(Abc_Ntk_t *pNtk,Gia_Man_t *pGia,int fVerbose)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  Vec_Str_t *vSop;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Gia_Man_t *pGVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  size_t __size;
  uint local_4c;
  Abc_Ntk_t *local_48;
  Gia_Man_t *local_40;
  long local_38;
  
  vSop = (Vec_Str_t *)malloc(0x10);
  vSop->nCap = 1000;
  vSop->nSize = 0;
  pcVar6 = (char *)malloc(1000);
  vSop->pArray = pcVar6;
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x8e,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  if (pNtk->vCis->nSize != pGia->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x8f,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  if (pNtk->vCos->nSize != pGia->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x90,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  local_4c = 0;
  pVVar10 = pNtk->vCos;
  pAVar4 = pNtk;
  pGVar9 = pGia;
  if (0 < pVVar10->nSize) {
    do {
      local_40 = pGVar9;
      local_48 = pAVar4;
      if ((int)local_4c < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar3 = *(long *)(*(long *)(*(long *)(*pVVar10->pArray[local_4c] + 0x20) + 8) +
                       (long)**(int **)((long)pVVar10->pArray[local_4c] + 0x20) * 8);
      if (((*(uint *)(lVar3 + 0x14) & 0xf) == 7) && (*(int *)(lVar3 + 0x1c) != 0)) {
        if (*(int *)(lVar3 + 0x1c) != pGia->vCis->nSize) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                        ,0x96,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        vSop->nSize = 0;
        pcVar6 = *(char **)(lVar3 + 0x38);
        local_38 = lVar3;
        sVar7 = strlen(pcVar6);
        if (0 < (int)(uint)sVar7) {
          uVar11 = 0;
          do {
            cVar1 = pcVar6[uVar11];
            uVar2 = vSop->nCap;
            if (vSop->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vSop->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(vSop->pArray,0x10);
                }
                __size = 0x10;
              }
              else {
                __size = (ulong)uVar2 * 2;
                if ((int)__size <= (int)uVar2) goto LAB_0053061c;
                if (vSop->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(__size);
                }
                else {
                  pcVar8 = (char *)realloc(vSop->pArray,__size);
                }
              }
              vSop->pArray = pcVar8;
              vSop->nCap = (int)__size;
            }
LAB_0053061c:
            iVar5 = vSop->nSize;
            vSop->nSize = iVar5 + 1;
            vSop->pArray[iVar5] = cVar1;
            uVar11 = uVar11 + 1;
          } while (((uint)sVar7 & 0x7fffffff) != uVar11);
        }
        lVar3 = local_38;
        pGia = local_40;
        uVar2 = vSop->nCap;
        if (vSop->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSop->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(vSop->pArray,0x10);
            }
            sVar7 = 0x10;
          }
          else {
            sVar7 = (ulong)uVar2 * 2;
            if ((int)sVar7 <= (int)uVar2) goto LAB_005306aa;
            if (vSop->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar7);
            }
            else {
              pcVar6 = (char *)realloc(vSop->pArray,sVar7);
            }
          }
          vSop->pArray = pcVar6;
          vSop->nCap = (int)sVar7;
        }
LAB_005306aa:
        iVar5 = vSop->nSize;
        vSop->nSize = iVar5 + 1;
        vSop->pArray[iVar5] = '\0';
        pGVar9 = Gia_ManDupCones(pGia,(int *)&local_4c,1,0);
        if (pGVar9->vCis->nSize != pGia->vCis->nSize) {
          __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                        ,0x9d,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
        }
        iVar5 = Abc_ObjExpandCubes(vSop,pGVar9,*(int *)(lVar3 + 0x1c));
        if (iVar5 != 0) {
          *(undefined4 *)(lVar3 + 0x1c) = 0;
        }
        Gia_ManStop(pGVar9);
        pNtk = local_48;
        pcVar6 = Abc_SopRegister((Mem_Flex_t *)local_48->pManFunc,vSop->pArray);
        *(char **)(lVar3 + 0x38) = pcVar6;
      }
      local_4c = local_4c + 1;
      pVVar10 = pNtk->vCos;
      pAVar4 = local_48;
      pGVar9 = local_40;
    } while ((int)local_4c < pVVar10->nSize);
  }
  if (vSop->pArray != (char *)0x0) {
    free(vSop->pArray);
    vSop->pArray = (char *)0x0;
  }
  free(vSop);
  Abc_NtkSortSops(pNtk);
  return;
}

Assistant:

void Abc_NtkExpandCubes( Abc_Ntk_t * pNtk, Gia_Man_t * pGia, int fVerbose )
{
    Gia_Man_t * pNew;
    Abc_Obj_t * pObj; int i;
    Vec_Str_t * vSop = Vec_StrAlloc( 1000 );
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia) );
    assert( Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_ObjFanin0(pObj);
        if ( !Abc_ObjIsNode(pObj) || Abc_ObjFaninNum(pObj) == 0 )
            continue;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia) );

        Vec_StrClear( vSop );
        Vec_StrAppend( vSop, (char *)pObj->pData );
        Vec_StrPush( vSop, '\0' );

        pNew = Gia_ManDupCones( pGia, &i, 1, 0 );
        assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia) );
        if ( Abc_ObjExpandCubes( vSop, pNew, Abc_ObjFaninNum(pObj) ) )
            Vec_IntClear( &pObj->vFanins );
        Gia_ManStop( pNew );

        pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Vec_StrArray(vSop) );
    }
    Vec_StrFree( vSop );
    Abc_NtkSortSops( pNtk );
}